

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfile.h
# Opt level: O0

void __thiscall CVmFile::write_str_short_prefix(CVmFile *this,char *str,size_t len)

{
  char *in_RDX;
  CVmFile *in_RSI;
  CVmFile *in_RDI;
  uint in_stack_ffffffffffffffdc;
  
  if ((char *)0xffff < in_RDX) {
    err_throw(0);
  }
  write_uint2(in_RDI,in_stack_ffffffffffffffdc);
  write_bytes(in_RSI,in_RDX,(size_t)in_RDI);
  return;
}

Assistant:

void write_str_short_prefix(const char *str, size_t len)
    {
        /* make sure it fits */
        if (len > 65535)
            err_throw(VMERR_WRITE_FILE);

        /* write the prefix and string */
        write_uint2((int)len);
        write_bytes(str, len);
    }